

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O1

PCSTR TagToString(int tag)

{
  uint uVar1;
  
  uVar1 = tag & 0xff;
  if (uVar1 < 0x40) {
    if (uVar1 == 0) {
      return "none(0)";
    }
    if (uVar1 == 1) {
      return "bool(1)";
    }
    if (uVar1 == 2) {
      return "any(2)";
    }
  }
  else {
    switch(uVar1) {
    case 0x7c:
      return "f64(7C)";
    case 0x7d:
      return "f32(7D)";
    case 0x7e:
      return "i64(7E)";
    case 0x7f:
      return "i32(7F)";
    case 0x80:
      return "Value(1)";
    case 0x81:
      return "Label(2)";
    case 0x82:
      return "w3Frame(3)";
    }
    if (uVar1 == 0x40) {
      return "empty(40)";
    }
  }
  return "unknown";
}

Assistant:

PCSTR TagToString (int tag)
{
    switch ((w3Tag)tag)
    {
    default:break;
    case Tag_none:     return "none(0)";
    case Tag_bool:     return "bool(1)";
    case Tag_any:      return "any(2)";
    case Tag_i32:      return "i32(7F)";
    case Tag_i64:      return "i64(7E)";
    case Tag_f32:      return "f32(7D)";
    case Tag_f64:      return "f64(7C)";
    case Tag_empty:    return "empty(40)";

    case Tag_Value:    return "Value(1)";
    case Tag_Label:    return "Label(2)";
    case Tag_Frame:    return "w3Frame(3)";
    }
    return "unknown";
}